

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O3

size_t __thiscall
juzzlin::Argengine::Impl::processDefinitionMatch
          (Impl *this,OptionDefinitionSP *match,ArgumentVector *tokens,size_t currentIndex,
          bool dryRun)

{
  pointer pbVar1;
  pointer pcVar2;
  element_type *peVar3;
  undefined8 uVar4;
  OptionDefinition *existing;
  OptionDefinitionSP innerMatch;
  value_type value;
  undefined1 local_80 [16];
  pointer local_70;
  undefined1 local_60 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  pointer local_40 [2];
  
  existing = (match->
             super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
  if ((existing->valuelessCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
    if ((existing->singleStringCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
      return currentIndex;
    }
    currentIndex = currentIndex + 1;
    pbVar1 = (tokens->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(tokens->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
        currentIndex) {
      throwNoValueError(this,existing);
    }
    if (!dryRun) {
      local_70 = (pointer)local_60;
      pcVar2 = pbVar1[currentIndex]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar2,pcVar2 + pbVar1[currentIndex]._M_string_length);
      getOptionDefinition((Impl *)local_80,(string *)this);
      if ((pointer)local_80._0_8_ != (pointer)0x0) {
        throwNoValueError(this,(match->
                               super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr);
      }
      if ((pointer)local_80._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
      }
      if (local_70 != (pointer)local_60) {
        operator_delete(local_70,(ulong)(local_60._0_8_ + 1));
      }
      pbVar1 = (tokens->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(tokens->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <=
          currentIndex) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                   currentIndex);
LAB_0010e273:
        uVar4 = std::__throw_bad_function_call();
        if ((pointer)local_80._8_8_ != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
        }
        if (local_70 != (pointer)local_60) {
          operator_delete(local_70,(ulong)(local_60._0_8_ + 1));
        }
        _Unwind_Resume(uVar4);
      }
      peVar3 = (match->
               super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      pcVar2 = pbVar1[currentIndex]._M_dataplus._M_p;
      local_50._M_allocated_capacity = (size_type)local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_60 + 0x10),pcVar2,pcVar2 + pbVar1[currentIndex]._M_string_length);
      if ((peVar3->singleStringCallback).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_0010e273;
      (*(peVar3->singleStringCallback)._M_invoker)
                ((_Any_data *)&peVar3->singleStringCallback,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_60 + 0x10));
      if ((pointer *)local_50._0_8_ != local_40) {
        operator_delete((void *)local_50._0_8_,
                        (ulong)((long)&(local_40[0]->
                                       super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + 1));
      }
    }
  }
  else {
    if (dryRun) goto LAB_0010e239;
    (*(existing->valuelessCallback)._M_invoker)((_Any_data *)&existing->valuelessCallback);
  }
  existing = (match->
             super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
LAB_0010e239:
  existing->applied = true;
  return currentIndex;
}

Assistant:

size_t processDefinitionMatch(OptionDefinitionSP match, const ArgumentVector & tokens, size_t currentIndex, bool dryRun) const
    {
        if (match->valuelessCallback) {
            if (!dryRun) {
                match->valuelessCallback();
            }
            match->applied = true;
        } else if (match->singleStringCallback) {
            if (++currentIndex < tokens.size()) {
                if (!dryRun) {
                    if (const auto value = tokens.at(currentIndex); const auto innerMatch = getOptionDefinition(value)) {
                        throwNoValueError(*match);
                    }
                    match->singleStringCallback(tokens.at(currentIndex));
                }
                match->applied = true;
            } else {
                throwNoValueError(*match);
            }
        }
        return currentIndex;
    }